

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O1

void __thiscall sznet::Thread::~Thread(Thread *this)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  
  if ((this->m_started == true) && (this->m_joined == false)) {
    sz_thread_detach(this->m_pthreadId);
  }
  sz_cond_fini(&(this->m_latch).m_condition.m_cond);
  MutexLock::~MutexLock(&(this->m_latch).m_mutex);
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_name).field_2) {
    operator_delete(pcVar1);
  }
  p_Var2 = (this->m_func).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_func,(_Any_data *)&this->m_func,__destroy_functor);
  }
  return;
}

Assistant:

Thread::~Thread()
{
	if (m_started && !m_joined)
	{
		sz_thread_detach(m_pthreadId);
	}
}